

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::read_matching(lexer *this,char *s)

{
  int iVar1;
  json_parser_exception *this_00;
  size_t byte_index;
  long lVar2;
  int local_1c;
  char c;
  int i;
  char *s_local;
  lexer *this_local;
  
  local_1c = 0;
  do {
    if (s[local_1c] == '\0') {
      return;
    }
    iVar1 = (*this->m_reader->_vptr_reader[2])();
    lVar2 = (long)local_1c;
    local_1c = local_1c + 1;
  } while ((char)iVar1 == s[lVar2]);
  this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  byte_index = reader::get_byte_index(this->m_reader);
  json_parser_exception::json_parser_exception(this_00,invalid_character_e,(char)iVar1,byte_index);
  __cxa_throw(this_00,&json_parser_exception::typeinfo,json_parser_exception::~json_parser_exception
             );
}

Assistant:

void lexer::read_matching(const char *s)
{
    int i = 0;
    while (s[i] != 0)
    {
        char c = m_reader.next();

        if (c != s[i++])
        {
            throw json_parser_exception(json_parser_exception::invalid_character_e, c, m_reader.get_byte_index());
        }
    }
}